

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  _InputArray local_198;
  string local_180;
  string local_160;
  Mat image;
  RaspiCam_Cv Camera;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc == 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage (-help for help)");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"-help",(allocator<char> *)&Camera);
  iVar3 = findParam(&local_180,argc,argv);
  std::__cxx11::string::~string((string *)&local_180);
  if (iVar3 == -1) {
    raspicam::RaspiCam_Cv::RaspiCam_Cv(&Camera);
    processCommandLine(argc,argv,&Camera);
    poVar4 = std::operator<<((ostream *)&std::cout,"Connecting to camera");
    std::endl<char,std::char_traits<char>>(poVar4);
    cVar1 = raspicam::RaspiCam::open(SUB81(&Camera,0));
    if (cVar1 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error opening camera");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar3 = -1;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Connected to camera =");
      raspicam::RaspiCam_Cv::getId_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,(string *)&image);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&image);
      cv::Mat::Mat(&image);
      poVar4 = std::operator<<((ostream *)&std::cout,"Capturing");
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar5 = cv::getTickCount();
      iVar3 = 0;
      while( true ) {
        uVar2 = (ushort)iVar3 & 0xff;
        if (iVar3 == 100) break;
        raspicam::RaspiCam::grab();
        raspicam::RaspiCam_Cv::retrieve((Mat *)&Camera);
        if (doTestSpeedOnly == false) {
          if ((char)((char)(uVar2 / 5) * -5 + (char)iVar3) == '\0') {
            poVar4 = std::operator<<((ostream *)&std::cout,"\r capturing ...");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
            poVar4 = std::operator<<(poVar4,"/");
            std::ostream::operator<<(poVar4,100);
            std::ostream::flush();
          }
          if ((iVar3 != 0) && ((char)((char)(uVar2 / 0x1e) * -0x1e + (char)iVar3) == '\0')) {
            std::__cxx11::to_string(&local_160,iVar3);
            std::operator+(&local_70,"image",&local_160);
            std::operator+(&local_50,&local_70,".jpg");
            local_198.sz.width = 0;
            local_198.sz.height = 0;
            local_198.flags = 0x1010000;
            local_1b8 = 0;
            uStack_1b0 = 0;
            local_1a8 = 0;
            local_198.obj = &image;
            cv::imwrite((string *)&local_50,&local_198,(vector *)&local_1b8);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_160);
          }
        }
        iVar3 = iVar3 + 1;
      }
      if (doTestSpeedOnly == false) {
        poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar4 = std::operator<<(poVar4,"Images saved in imagexx.jpg");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      lVar6 = cv::getTickCount();
      dVar7 = (double)cv::getTickFrequency();
      dVar7 = ((double)lVar6 - (double)lVar5) / dVar7;
      poVar4 = std::ostream::_M_insert<double>(dVar7);
      poVar4 = std::operator<<(poVar4," seconds for ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,100);
      poVar4 = std::operator<<(poVar4,"  frames : FPS = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)(100.0 / dVar7));
      std::endl<char,std::char_traits<char>>(poVar4);
      raspicam::RaspiCam::release();
      cv::Mat::~Mat(&image);
      iVar3 = 0;
    }
    raspicam::RaspiCam_Cv::~RaspiCam_Cv(&Camera);
  }
  else {
    showUsage();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int main ( int argc,char **argv ) {
    if ( argc==1 ) {
        cerr<<"Usage (-help for help)"<<endl;
    }
    if ( findParam ( "-help",argc,argv ) !=-1 ) {
        showUsage();
        return -1;
    }

    raspicam::RaspiCam_Cv Camera;
    processCommandLine ( argc,argv,Camera );
    cout<<"Connecting to camera"<<endl;
    if ( !Camera.open() ) {
        cerr<<"Error opening camera"<<endl;
        return -1;
    }
    cout<<"Connected to camera ="<<Camera.getId() <<endl;

    cv::Mat image;
    int nCount=100;
    cout<<"Capturing"<<endl;

    double time_=cv::getTickCount();

    for ( int i=0; i<nCount; i++ ) {
        Camera.grab();
        Camera.retrieve ( image );
        if ( !doTestSpeedOnly ) {
            if ( i%5==0 ) 	  cout<<"\r capturing ..."<<i<<"/"<<nCount<<std::flush;
            if ( i%30==0 && i!=0 )
                cv::imwrite ("image"+std::to_string(i)+".jpg",image );
        }
    }
    if ( !doTestSpeedOnly )  cout<<endl<<"Images saved in imagexx.jpg"<<endl;
    double secondsElapsed= double ( cv::getTickCount()-time_ ) /double ( cv::getTickFrequency() ); //time in second
    cout<< secondsElapsed<<" seconds for "<< nCount<<"  frames : FPS = "<< ( float ) ( ( float ) ( nCount ) /secondsElapsed ) <<endl;
    Camera.release();

}